

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_template_checker.cpp
# Opt level: O0

void __thiscall
validation_layer::validationCheckerTemplate::~validationCheckerTemplate
          (validationCheckerTemplate *this)

{
  validationCheckerTemplate *this_local;
  
  if ((this->enableValidationCheckerTemplate & 1U) != 0) {
    if (templateChecker != (long *)0x0) {
      (**(code **)(*templateChecker + 0xcb8))();
    }
    if (DAT_00322fa0 != (long *)0x0) {
      (**(code **)(*DAT_00322fa0 + 0x458))();
    }
    if (DAT_00322f98 != (long *)0x0) {
      (**(code **)(*DAT_00322f98 + 0x958))();
    }
  }
  return;
}

Assistant:

validationCheckerTemplate::~validationCheckerTemplate() {
        if(enableValidationCheckerTemplate) {
            delete templateChecker.zeValidation;
            delete templateChecker.zetValidation;
            delete templateChecker.zesValidation;
        }
    }